

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall CServer::CServer(CServer *this)

{
  undefined8 *in_RDI;
  char *in_stack_ffffffffffffffa8;
  CServer *in_stack_ffffffffffffffb0;
  CSnapshotDelta *in_stack_ffffffffffffffb8;
  
  IServer::IServer(&in_stack_ffffffffffffffb0->super_IServer);
  *in_RDI = &PTR__CServer_00184650;
  CSnapshotDelta::CSnapshotDelta((CSnapshotDelta *)in_stack_ffffffffffffffb0);
  CSnapIDPool::CSnapIDPool((CSnapIDPool *)0x10e2f6);
  CNetServer::CNetServer((CNetServer *)(in_RDI + 0xd919d));
  CEcon::CEcon((CEcon *)0x10e321);
  CServerBan::CServerBan((CServerBan *)in_stack_ffffffffffffffb0);
  CDemoRecorder::CDemoRecorder((CDemoRecorder *)(in_RDI + 0x127f6c),in_stack_ffffffffffffffb8);
  CRegister::CRegister((CRegister *)in_stack_ffffffffffffffb0);
  *(undefined4 *)((long)in_RDI + 0x14) = 0x32;
  in_RDI[3] = 0;
  *(undefined4 *)(in_RDI + 2) = 0;
  *(undefined1 *)(in_RDI + 0x127f46) = 1;
  str_copy((char *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0);
  in_RDI[0x127f65] = 0;
  *(undefined4 *)(in_RDI + 0x127f66) = 0;
  *(undefined4 *)(in_RDI + 0x127f6a) = 0;
  in_RDI[0x127f69] = 0;
  in_RDI[0x127f68] = 0;
  in_RDI[0x127f67] = 0;
  *(undefined1 *)((long)in_RDI + 0x93fa31) = 0;
  *(undefined4 *)((long)in_RDI + 0x93fa34) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x127f47) = 2;
  *(undefined4 *)((long)in_RDI + 0x93fb54) = 0;
  *(undefined4 *)(in_RDI + 0x127f6b) = 0;
  Init(in_stack_ffffffffffffffb0);
  return;
}

Assistant:

CServer::CServer() : m_DemoRecorder(&m_SnapshotDelta)
{
	m_TickSpeed = SERVER_TICK_SPEED;

	m_pGameServer = 0;

	m_CurrentGameTick = 0;
	m_RunServer = true;

	str_copy(m_aShutdownReason, "Server shutdown", sizeof(m_aShutdownReason));

	m_pCurrentMapData = 0;
	m_CurrentMapSize = 0;

	m_NumMapEntries = 0;
	m_pFirstMapEntry = 0;
	m_pLastMapEntry = 0;
	m_pMapListHeap = 0;

	m_MapReload = false;

	m_RconClientID = IServer::RCON_CID_SERV;
	m_RconAuthLevel = AUTHED_ADMIN;

	m_RconPasswordSet = 0;
	m_GeneratedRconPassword = 0;

	Init();
}